

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

FaceIter __thiscall CMU462::HalfedgeMesh::newBoundary(HalfedgeMesh *this)

{
  iterator iVar1;
  Face local_a0;
  
  memset(&local_a0,0,0x88);
  local_a0._isBoundary = true;
  iVar1 = std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::emplace<CMU462::Face>
                    (&this->boundaries,(const_iterator)&this->boundaries,&local_a0);
  return (FaceIter)iVar1._M_node;
}

Assistant:

FaceIter newBoundary() { return boundaries.insert(boundaries.end(), Face(true)); }